

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

optional<double> slang::parseDouble(string_view name,string_view value,string *error)

{
  bool bVar1;
  size_type extraout_RAX;
  size_type sVar2;
  size_t *pos_00;
  v9 *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view str;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  optional<double> oVar3;
  basic_string_view<char,_std::char_traits<char>_> *local_258 [2];
  string local_248;
  string *local_228;
  size_t local_220;
  size_type local_218;
  size_t pos;
  string local_200;
  string *local_1e0;
  string *error_local;
  string_view value_local;
  string_view name_local;
  optional<double> val;
  undefined1 local_198 [16];
  v9 *local_188;
  char *local_180;
  char **local_178;
  size_t local_170;
  char *pcStack_168;
  string *local_160;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_158;
  undefined1 local_138 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  char *local_120;
  char **local_118;
  v9 *local_110;
  basic_string_view<char,_std::char_traits<char>_> *local_108;
  char *pcStack_100;
  string *local_f8;
  basic_string_view<char,_std::char_traits<char>_> **local_f0;
  basic_string_view<char,_std::char_traits<char>_> *local_e8;
  char *pcStack_e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  char *local_a0;
  size_t *local_98;
  char *local_90;
  size_t *local_88;
  char *local_80;
  basic_string_view<char,_std::char_traits<char>_> **local_78;
  char *local_70;
  basic_string_view<char,_std::char_traits<char>_> **local_68;
  char *local_60;
  char *local_58;
  size_t *local_50;
  v9 *local_48;
  char *pcStack_40;
  bool *local_38;
  undefined1 *local_30;
  bool *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  bool *local_10;
  
  this = (v9 *)name._M_str;
  value_local._M_str = (char *)name._M_len;
  pos_00 = (size_t *)value._M_str;
  error_local = (string *)value._M_len;
  local_1e0 = error;
  value_local._M_len = (size_t)pos_00;
  name_local._M_len = (size_t)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&error_local);
  if (bVar1) {
    local_98 = &pos;
    local_a0 = "expected value for argument \'{}\'";
    local_90 = "expected value for argument \'{}\'";
    pos = (size_t)anon_var_dwarf_2b8911;
    local_88 = local_98;
    local_180 = (char *)std::char_traits<char>::length("expected value for argument \'{}\'");
    local_60 = local_a0;
    local_160 = &local_200;
    local_170 = pos;
    local_178 = &value_local._M_str;
    local_50 = &local_170;
    local_188 = (v9 *)pos;
    pcStack_168 = local_180;
    local_48 = local_188;
    pcStack_40 = local_180;
    val.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _8_8_ = ::fmt::v9::
            make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&>
                      ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)local_178,this,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_160);
    local_30 = local_198;
    local_38 = &val.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_engaged;
    local_20 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_180;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v9::vformat_abi_cxx11_(&local_200,local_188,fmt,args);
    std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::optional<double>::optional((optional<double> *)&name_local._M_str);
    local_218 = extraout_RAX;
  }
  else {
    local_228 = error_local;
    local_220 = value_local._M_len;
    str._M_str = (char *)&local_218;
    str._M_len = value_local._M_len;
    oVar3 = strToDouble((slang *)error_local,str,pos_00);
    name_local._M_str =
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_payload;
    val.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload._0_1_ =
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&name_local._M_str);
    if ((!bVar1) ||
       (sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&error_local),
       local_218 != sVar2)) {
      local_78 = local_258;
      local_80 = "invalid value \'{}\' for float argument \'{}\'";
      local_70 = "invalid value \'{}\' for float argument \'{}\'";
      local_258[0] = (basic_string_view<char,_std::char_traits<char>_> *)0x6e0441;
      local_68 = local_78;
      local_120 = (char *)std::char_traits<char>::length
                                    ("invalid value \'{}\' for float argument \'{}\'");
      local_58 = local_80;
      local_f8 = &local_248;
      local_108 = local_258[0];
      local_110 = (v9 *)&error_local;
      local_118 = &value_local._M_str;
      local_f0 = &local_108;
      local_128 = local_258[0];
      pcStack_100 = local_120;
      local_e8 = local_128;
      pcStack_e0 = local_120;
      ::fmt::v9::
      make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                (&local_158,local_110,(basic_string_view<char,_std::char_traits<char>_> *)local_118,
                 local_258[0]);
      local_c8 = local_138;
      local_d0 = &local_158;
      local_b0 = 0xdd;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = local_120;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_d0;
      local_c0 = local_d0;
      local_b8 = local_d0;
      local_a8 = local_c8;
      ::fmt::v9::vformat_abi_cxx11_(&local_248,(v9 *)local_128,fmt_00,args_00);
      std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_248);
      local_218 = std::__cxx11::string::~string((string *)&local_248);
    }
  }
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)(local_218 >> 8);
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)val.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload._0_1_;
  oVar3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)name_local._M_str;
  return (optional<double>)
         oVar3.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

static std::optional<double> parseDouble(string_view name, string_view value, std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    size_t pos;
    std::optional<double> val = strToDouble(value, &pos);
    if (!val || pos != value.size())
        error = fmt::format("invalid value '{}' for float argument '{}'", value, name);

    return val;
}